

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O0

void write_vram(Emulator *e,MaskedAddress addr,u8 value)

{
  Bool BVar1;
  u8 value_local;
  MaskedAddress addr_local;
  Emulator *e_local;
  
  ppu_synchronize(e);
  BVar1 = is_using_vram(e,TRUE);
  if (BVar1 == FALSE) {
    if (0x1fff < addr) {
      __assert_fail("addr <= ADDR_MASK_8K",
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/emulator.c"
                    ,0x7df,"void write_vram(Emulator *, MaskedAddress, u8)");
    }
    (e->state).vram.data[(int)((uint)(e->state).vram.offset + (uint)addr)] = value;
  }
  else {
    HOOK_write_vram_in_use_ab(e,"write_vram",(ulong)addr,(ulong)value);
  }
  return;
}

Assistant:

static void write_vram(Emulator* e, MaskedAddress addr, u8 value) {
  ppu_synchronize(e);
  if (UNLIKELY(is_using_vram(e, TRUE))) {
    HOOK(write_vram_in_use_ab, addr, value);
    return;
  }

  assert(addr <= ADDR_MASK_8K);
  VRAM.data[VRAM.offset + addr] = value;
}